

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2b_Simd256.c
# Opt level: O0

void Hacl_Hash_Blake2b_Simd256_reset_with_key(Hacl_Hash_Blake2b_Simd256_state_t *s,uint8_t *k)

{
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key;
  Hacl_Hash_Blake2b_index HVar1;
  undefined1 local_98 [8];
  Hacl_Hash_Blake2b_blake2_params p0;
  Hacl_Hash_Blake2b_blake2_params p;
  uint8_t personal [16];
  uint8_t salt [16];
  uint8_t local_1a;
  uint8_t uStack_19;
  Hacl_Hash_Blake2b_index idx;
  uint8_t *k_local;
  Hacl_Hash_Blake2b_Simd256_state_t *s_local;
  
  HVar1 = index_of_state(s);
  memset(personal + 8,0,0x10);
  memset(&p.personal,0,0x10);
  uStack_19 = HVar1.digest_length;
  p0.personal._0_1_ = uStack_19;
  local_1a = HVar1.key_length;
  p0.personal._1_1_ = local_1a;
  p0.personal._2_1_ = 1;
  p0.personal._3_1_ = 1;
  p0.personal._4_4_ = 0;
  p.digest_length = '\0';
  p.key_length = '\0';
  p.fanout = '\0';
  p.depth = '\0';
  p.leaf_length = 0;
  p.node_offset._0_1_ = 0;
  p.node_offset._1_1_ = 0;
  p._16_8_ = personal + 8;
  p.salt = (uint8_t *)&p.personal;
  memcpy(local_98,&p0.personal,0x28);
  key.snd = k;
  key.fst = (Hacl_Hash_Blake2b_blake2_params *)local_98;
  reset_raw(s,key);
  return;
}

Assistant:

void Hacl_Hash_Blake2b_Simd256_reset_with_key(Hacl_Hash_Blake2b_Simd256_state_t *s, uint8_t *k)
{
  Hacl_Hash_Blake2b_index idx = index_of_state(s);
  uint8_t salt[16U] = { 0U };
  uint8_t personal[16U] = { 0U };
  Hacl_Hash_Blake2b_blake2_params
  p =
    {
      .digest_length = idx.digest_length, .key_length = idx.key_length, .fanout = 1U, .depth = 1U,
      .leaf_length = 0U, .node_offset = 0ULL, .node_depth = 0U, .inner_length = 0U, .salt = salt,
      .personal = personal
    };
  Hacl_Hash_Blake2b_blake2_params p0 = p;
  reset_raw(s, ((K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_){ .fst = &p0, .snd = k }));
}